

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

double __thiscall r_exec::exp(r_exec *this,double __x)

{
  byte bVar1;
  uint16_t uVar2;
  _Context *in_RSI;
  uint uVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  Atom local_58 [4];
  undefined4 local_54;
  Atom local_50 [16];
  Context local_40;
  undefined1 local_30 [8];
  Context arg;
  uint16_t *index_local;
  Context *context_local;
  
  arg.implementation = in_RSI;
  Context::getChild(&local_40,(uint16_t)this);
  Context::operator*((Context *)local_30);
  Context::~Context(&local_40);
  Context::operator[]((Context *)local_30,0);
  bVar1 = r_code::Atom::isFloat();
  if ((bVar1 & 1) == 0) {
    r_code::Atom::Nil();
    uVar2 = Context::setAtomicResult((Context *)this,local_58);
    *(uint16_t *)&(arg.implementation)->_vptr__Context = uVar2;
    r_code::Atom::~Atom(local_58);
  }
  else {
    Context::operator[]((Context *)local_30,0);
    uVar3 = r_code::Atom::asFloat();
    dVar4 = std::exp((double)(ulong)uVar3);
    r_code::Atom::Float(SUB84(dVar4,0));
    uVar2 = Context::setAtomicResult((Context *)this,local_50);
    *(uint16_t *)&(arg.implementation)->_vptr__Context = uVar2;
    r_code::Atom::~Atom(local_50);
  }
  local_54 = 1;
  Context::~Context((Context *)local_30);
  return extraout_XMM0_Qa;
}

Assistant:

bool exp(const Context &context, uint16_t &index)
{
    Context arg = *context.getChild(1);

    if (arg[0].isFloat()) {
        index = context.setAtomicResult(Atom::Float(::exp(arg[0].asFloat())));
        return true;
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}